

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error split_sdf_shape(SDF_Shape *shape)

{
  SDF_Edge_Type SVar1;
  SDF_Edge *__src;
  FT_UInt local_f0;
  FT_UInt local_e8;
  undefined1 local_d8 [8];
  FT_26D6_Vec ctrls_1 [4];
  FT_UInt num_splits;
  FT_26D6 dy;
  FT_26D6 dx;
  FT_26D6_Vec ctrls [3];
  SDF_Edge *temp;
  SDF_Edge *edge;
  SDF_Contour *tempc;
  SDF_Edge *new_edges;
  SDF_Edge *edges;
  SDF_Contour *new_contours;
  SDF_Contour *contours;
  FT_Memory memory;
  SDF_Shape *pSStack_10;
  FT_Error error;
  SDF_Shape *shape_local;
  
  memory._4_4_ = 0;
  edges = (SDF_Edge *)0x0;
  if ((shape == (SDF_Shape *)0x0) || (shape->memory == (FT_Memory)0x0)) {
    memory._4_4_ = 6;
  }
  else {
    new_contours = shape->contours;
    contours = (SDF_Contour *)shape->memory;
    pSStack_10 = shape;
    while (new_contours != (SDF_Contour *)0x0) {
      new_edges = new_contours->edges;
      tempc = (SDF_Contour *)0x0;
      for (; __src = new_edges, new_edges != (SDF_Edge *)0x0; new_edges = new_edges->next) {
        SVar1 = new_edges->edge_type;
        if (SVar1 == SDF_EDGE_LINE) {
          memory._4_4_ = sdf_edge_new((FT_Memory)contours,(SDF_Edge **)&ctrls[2].y);
          if (memory._4_4_ != 0) {
            return memory._4_4_;
          }
          memcpy((void *)ctrls[2].y,__src,0x50);
          *(SDF_Contour **)(ctrls[2].y + 0x48) = tempc;
          tempc = (SDF_Contour *)ctrls[2].y;
        }
        else if (SVar1 == SDF_EDGE_CONIC) {
          _dy = (new_edges->start_pos).x;
          ctrls[0].x = (new_edges->start_pos).y;
          ctrls[0].y = (new_edges->control_a).x;
          ctrls[1].x = (new_edges->control_a).y;
          ctrls[1].y = (new_edges->end_pos).x;
          ctrls[2].x = (new_edges->end_pos).y;
          if (ctrls[1].y + _dy + ctrls[0].y * -2 < 0) {
            local_e8 = -((int)ctrls[1].y + (int)_dy + (int)ctrls[0].y * -2);
          }
          else {
            local_e8 = (int)ctrls[1].y + (int)_dy + (int)ctrls[0].y * -2;
          }
          if (ctrls[2].x + ctrls[0].x + ctrls[1].x * -2 < 0) {
            local_f0 = -((int)ctrls[2].x + (int)ctrls[0].x + (int)ctrls[1].x * -2);
          }
          else {
            local_f0 = (int)ctrls[2].x + (int)ctrls[0].x + (int)ctrls[1].x * -2;
          }
          num_splits = local_e8;
          if ((int)local_e8 < (int)local_f0) {
            num_splits = local_f0;
          }
          ctrls_1[3].y._4_4_ = 1;
          for (; 8 < (int)num_splits; num_splits = (int)num_splits >> 2) {
            ctrls_1[3].y._4_4_ = ctrls_1[3].y._4_4_ << 1;
          }
          memory._4_4_ = split_sdf_conic((FT_Memory)contours,(FT_26D6_Vec *)&dy,ctrls_1[3].y._4_4_,
                                         (SDF_Edge **)&tempc);
        }
        else if (SVar1 == SDF_EDGE_CUBIC) {
          local_d8 = (undefined1  [8])(new_edges->start_pos).x;
          ctrls_1[0].x = (new_edges->start_pos).y;
          ctrls_1[0].y = (new_edges->control_a).x;
          ctrls_1[1].x = (new_edges->control_a).y;
          ctrls_1[1].y = (new_edges->control_b).x;
          ctrls_1[2].x = (new_edges->control_b).y;
          ctrls_1[2].y = (new_edges->end_pos).x;
          ctrls_1[3].x = (new_edges->end_pos).y;
          memory._4_4_ = split_sdf_cubic((FT_Memory)contours,(FT_26D6_Vec *)local_d8,0x20,
                                         (SDF_Edge **)&tempc);
        }
        else {
          memory._4_4_ = 6;
        }
        if (memory._4_4_ != 0) {
          return memory._4_4_;
        }
      }
      memory._4_4_ = sdf_contour_new((FT_Memory)contours,(SDF_Contour **)&edge);
      if (memory._4_4_ != 0) {
        return memory._4_4_;
      }
      (edge->end_pos).y = (FT_Pos)edges;
      (edge->end_pos).x = (FT_Pos)tempc;
      edges = edge;
      tempc = (SDF_Contour *)0x0;
      edge = (SDF_Edge *)new_contours;
      new_contours = new_contours->next;
      sdf_contour_done((FT_Memory)contours,(SDF_Contour **)&edge);
    }
    pSStack_10->contours = (SDF_Contour *)edges;
  }
  return memory._4_4_;
}

Assistant:

static FT_Error
  split_sdf_shape( SDF_Shape*  shape )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    SDF_Contour*  contours;
    SDF_Contour*  new_contours = NULL;


    if ( !shape || !shape->memory )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    contours = shape->contours;
    memory   = shape->memory;

    /* for each contour */
    while ( contours )
    {
      SDF_Edge*  edges     = contours->edges;
      SDF_Edge*  new_edges = NULL;

      SDF_Contour*  tempc;


      /* for each edge */
      while ( edges )
      {
        SDF_Edge*  edge = edges;
        SDF_Edge*  temp;

        switch ( edge->edge_type )
        {
        case SDF_EDGE_LINE:
          /* Just create a duplicate edge in case     */
          /* it is a line.  We can use the same edge. */
          FT_CALL( sdf_edge_new( memory, &temp ) );

          ft_memcpy( temp, edge, sizeof ( *edge ) );

          temp->next = new_edges;
          new_edges  = temp;
          break;

        case SDF_EDGE_CONIC:
          /* Subdivide the curve and add it to the list. */
          {
            FT_26D6_Vec  ctrls[3];
            FT_26D6      dx, dy;
            FT_UInt      num_splits;


            ctrls[0] = edge->start_pos;
            ctrls[1] = edge->control_a;
            ctrls[2] = edge->end_pos;

            dx = FT_ABS( ctrls[2].x + ctrls[0].x - 2 * ctrls[1].x );
            dy = FT_ABS( ctrls[2].y + ctrls[0].y - 2 * ctrls[1].y );
            if ( dx < dy )
              dx = dy;

            /* Calculate the number of necessary bisections.  Each      */
            /* bisection causes a four-fold reduction of the deviation, */
            /* hence we bisect the Bezier curve until the deviation     */
            /* becomes less than 1/8 of a pixel.  For more details      */
            /* check file `ftgrays.c`.                                  */
            num_splits = 1;
            while ( dx > ONE_PIXEL / 8 )
            {
              dx         >>= 2;
              num_splits <<= 1;
            }

            error = split_sdf_conic( memory, ctrls, num_splits, &new_edges );
          }
          break;

        case SDF_EDGE_CUBIC:
          /* Subdivide the curve and add it to the list. */
          {
            FT_26D6_Vec  ctrls[4];


            ctrls[0] = edge->start_pos;
            ctrls[1] = edge->control_a;
            ctrls[2] = edge->control_b;
            ctrls[3] = edge->end_pos;

            error = split_sdf_cubic( memory, ctrls, 32, &new_edges );
          }
          break;

        default:
          error = FT_THROW( Invalid_Argument );
        }

        if ( error != FT_Err_Ok )
          goto Exit;

        edges = edges->next;
      }

      /* add to the contours list */
      FT_CALL( sdf_contour_new( memory, &tempc ) );

      tempc->next  = new_contours;
      tempc->edges = new_edges;
      new_contours = tempc;
      new_edges    = NULL;

      /* deallocate the contour */
      tempc    = contours;
      contours = contours->next;

      sdf_contour_done( memory, &tempc );
    }

    shape->contours = new_contours;

  Exit:
    return error;
  }